

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

bool __thiscall ON_PolyCurve::IsNested(ON_PolyCurve *this)

{
  uint uVar1;
  ulong uVar2;
  ON_PolyCurve *pOVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  uVar5 = 0;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  do {
    uVar4 = uVar2;
    if (uVar5 == uVar4) break;
    pOVar3 = Cast((ON_Object *)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar4]);
    uVar2 = uVar4 + 1;
  } while (pOVar3 == (ON_PolyCurve *)0x0);
  return (long)uVar4 < (long)(int)uVar1;
}

Assistant:

bool ON_PolyCurve::IsNested() const
{
  int i, count = m_segment.Count();
	for ( i = 0; i < count; i++ )
  {
    if (  ON_PolyCurve::Cast(m_segment[i]) )
      return true;
  }
  return false;
}